

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

SyntaxKind slang::syntax::SyntaxFacts::getIntegerType(TokenKind kind)

{
  TokenKind kind_local;
  undefined4 local_4;
  
  if (kind == BitKeyword) {
    local_4 = BitType;
  }
  else if (kind == ByteKeyword) {
    local_4 = ByteType;
  }
  else if (kind == IntKeyword) {
    local_4 = IntType;
  }
  else if (kind == IntegerKeyword) {
    local_4 = IntegerType;
  }
  else if (kind == LogicKeyword) {
    local_4 = LogicType;
  }
  else if (kind == LongIntKeyword) {
    local_4 = LongIntType;
  }
  else if (kind == RegKeyword) {
    local_4 = RegType;
  }
  else if (kind == ShortIntKeyword) {
    local_4 = ShortIntType;
  }
  else if (kind == TimeKeyword) {
    local_4 = TimeType;
  }
  else {
    local_4 = Unknown;
  }
  return local_4;
}

Assistant:

SyntaxKind SyntaxFacts::getIntegerType(TokenKind kind) {
    switch (kind) {
        case TokenKind::BitKeyword: return SyntaxKind::BitType;
        case TokenKind::LogicKeyword: return SyntaxKind::LogicType;
        case TokenKind::RegKeyword: return SyntaxKind::RegType;
        case TokenKind::ByteKeyword: return SyntaxKind::ByteType;
        case TokenKind::ShortIntKeyword: return SyntaxKind::ShortIntType;
        case TokenKind::IntKeyword: return SyntaxKind::IntType;
        case TokenKind::LongIntKeyword: return SyntaxKind::LongIntType;
        case TokenKind::IntegerKeyword: return SyntaxKind::IntegerType;
        case TokenKind::TimeKeyword: return SyntaxKind::TimeType;
        default: return SyntaxKind::Unknown;
    }
}